

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O1

int mwFlushR(void)

{
  if ((mwFlushing == mwFlushingB1) && (mwFlushing == mwFlushingB2)) {
    return mwFlushing;
  }
  if (mwFlushing == mwFlushingB1) {
    mwFlushingB2 = mwFlushing;
  }
  if (mwFlushing == mwFlushingB2) {
    mwFlushingB1 = mwFlushing;
  }
  if (mwFlushingB1 == mwFlushingB2) {
    mwFlushing = mwFlushingB1;
  }
  if (mwFlushingB2 == mwFlushing && mwFlushingB1 == mwFlushing) {
    mwWrite("internal: flushing flag damaged and recovered\n");
    mwFlush();
  }
  else {
    mwWrite("internal: flushing flag destroyed, so set to true\n");
    mwFlushingB2 = 1;
    mwFlushingB1 = 1;
    mwFlushing = 1;
  }
  return mwFlushing;
}

Assistant:

static int mwFlushR()
{
	if ((mwFlushing == mwFlushingB1) && (mwFlushing == mwFlushingB2)) {
		return mwFlushing;
	}
	if (mwFlushing == mwFlushingB1) {
		mwFlushingB2 = mwFlushing;
	}
	if (mwFlushing == mwFlushingB2) {
		mwFlushingB1 = mwFlushing;
	}
	if (mwFlushingB1 == mwFlushingB2) {
		mwFlushing = mwFlushingB1;
	}
	if ((mwFlushing == mwFlushingB1) && (mwFlushing == mwFlushingB2)) {
		mwWrite("internal: flushing flag damaged and recovered\n");
		FLUSH();
		return mwFlushing;
	}
	mwWrite("internal: flushing flag destroyed, so set to true\n");
	mwFlushing = mwFlushingB1 = mwFlushingB2 = 1;
	return 1;
}